

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleRPathCheckCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  ostream *poVar5;
  ulong uVar6;
  int iVar7;
  allocator local_1e2;
  allocator local_1e1;
  cmCommand *local_1e0;
  char *local_1d8;
  char *local_1d0;
  string local_1c8;
  ostringstream e;
  
  local_1d0 = (char *)0x0;
  local_1d8 = (char *)0x0;
  iVar7 = 0;
  uVar6 = 1;
  local_1e0 = &this->super_cmCommand;
  for (; pcVar3 = local_1d0, pcVar2 = local_1d8,
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar6 = (ulong)((int)uVar6 + 1)) {
    bVar4 = std::operator==(pbVar1 + uVar6,"RPATH");
    if (bVar4) {
      iVar7 = 2;
    }
    else {
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar6,"FILE");
      if (bVar4) {
        iVar7 = 1;
      }
      else {
        if (iVar7 == 2) {
          local_1d8 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar6]._M_dataplus._M_p;
        }
        else {
          if (iVar7 != 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar5 = std::operator<<((ostream *)&e,"RPATH_CHECK given unknown argument ");
            std::operator<<(poVar5,(string *)
                                   ((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar6));
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(local_1e0,&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
            return false;
          }
          local_1d0 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar6]._M_dataplus._M_p;
        }
        iVar7 = 0;
      }
    }
  }
  if (local_1d0 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&e,"RPATH_CHECK not given FILE option.",(allocator *)&local_1c8);
    cmCommand::SetError(local_1e0,(string *)&e);
  }
  else {
    if (local_1d8 != (char *)0x0) {
      bVar4 = cmsys::SystemTools::FileExists(local_1d0,true);
      if (!bVar4) {
        return true;
      }
      std::__cxx11::string::string((string *)&e,pcVar3,&local_1e1);
      std::__cxx11::string::string((string *)&local_1c8,pcVar2,&local_1e2);
      bVar4 = cmSystemTools::CheckRPath((string *)&e,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&e);
      if (!bVar4) {
        std::__cxx11::string::string((string *)&e,pcVar3,(allocator *)&local_1c8);
        cmsys::SystemTools::RemoveFile((string *)&e);
        std::__cxx11::string::~string((string *)&e);
        return true;
      }
      return true;
    }
    std::__cxx11::string::string
              ((string *)&e,"RPATH_CHECK not given RPATH option.",(allocator *)&local_1c8);
    cmCommand::SetError(local_1e0,(string *)&e);
  }
  std::__cxx11::string::~string((string *)&e);
  return false;
}

Assistant:

bool
cmFileCommand::HandleRPathCheckCommand(std::vector<std::string> const& args)
{
  // Evaluate arguments.
  const char* file = 0;
  const char* rpath = 0;
  enum Doing { DoingNone, DoingFile, DoingRPath };
  Doing doing = DoingNone;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "RPATH")
      {
      doing = DoingRPath;
      }
    else if(args[i] == "FILE")
      {
      doing = DoingFile;
      }
    else if(doing == DoingFile)
      {
      file = args[i].c_str();
      doing = DoingNone;
      }
    else if(doing == DoingRPath)
      {
      rpath = args[i].c_str();
      doing = DoingNone;
      }
    else
      {
      std::ostringstream e;
      e << "RPATH_CHECK given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
      }
    }
  if(!file)
    {
    this->SetError("RPATH_CHECK not given FILE option.");
    return false;
    }
  if(!rpath)
    {
    this->SetError("RPATH_CHECK not given RPATH option.");
    return false;
    }

  // If the file exists but does not have the desired RPath then
  // delete it.  This is used during installation to re-install a file
  // if its RPath will change.
  if(cmSystemTools::FileExists(file, true) &&
     !cmSystemTools::CheckRPath(file, rpath))
    {
    cmSystemTools::RemoveFile(file);
    }

  return true;
}